

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void render_symbol(element_t *element,render_context_t *context,render_state_t *state,float x,
                  float y,float width,float height)

{
  plutovg_matrix_t *matrix;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Bool _Var3;
  undefined4 in_ECX;
  uint uVar4;
  uint uVar5;
  plutovg_rect_t *view_box_00;
  view_position_t *position_00;
  float fVar6;
  float fVar7;
  undefined4 in_XMM2_Db;
  float fVar8;
  undefined4 in_XMM3_Db;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  plutovg_rect_t view_box;
  view_position_t position;
  undefined8 local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  ulong local_a8;
  undefined8 uStack_a0;
  undefined8 local_90;
  float local_88;
  undefined4 uStack_84;
  float local_78;
  undefined4 uStack_74;
  render_state_t local_68;
  undefined1 auVar9 [16];
  
  local_a8 = CONCAT44(local_a8._4_4_,y);
  local_b8._0_4_ = x;
  if (width <= 0.0) {
    return;
  }
  if (height <= 0.0) {
    return;
  }
  local_88 = height;
  uStack_84 = in_XMM3_Db;
  local_78 = width;
  uStack_74 = in_XMM2_Db;
  _Var3 = is_display_none(element);
  if (_Var3) {
    return;
  }
  render_state_begin(element,&local_68,state);
  local_68.view_height = local_88;
  local_68.view_width = local_78;
  matrix = &local_68.matrix;
  plutovg_matrix_translate(matrix,(float)local_b8._0_4_,(float)local_a8);
  local_c8 = 0;
  uStack_c0 = 0;
  _Var3 = parse_view_box(local_68.element,(int)&local_c8,view_box_00);
  if (!_Var3) goto LAB_00106144;
  local_90 = 5;
  parse_view_position(local_68.element,(int)&local_90,position_00);
  auVar10._4_4_ = uStack_74;
  auVar10._0_4_ = local_78;
  auVar10._8_4_ = uStack_74;
  auVar10._12_4_ = uStack_84;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = local_88;
  auVar9._0_4_ = local_78;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_c0;
  auVar11 = divps(auVar9,auVar2);
  local_a8 = uStack_c0;
  uStack_a0 = 0;
  fVar6 = auVar11._0_4_;
  if ((uint)local_90 == 0) {
    plutovg_matrix_scale(matrix,fVar6,auVar11._4_4_);
    plutovg_matrix_translate(matrix,-(float)local_c8,-local_c8._4_4_);
  }
  else {
    auVar1._4_4_ = -(uint)(fVar6 < auVar11._4_4_);
    auVar1._0_4_ = -(uint)(fVar6 < auVar11._4_4_);
    auVar1._8_4_ = -(uint)(auVar11._4_4_ < fVar6);
    auVar1._12_4_ = -(uint)(auVar11._4_4_ < fVar6);
    uVar4 = movmskpd(in_ECX,auVar1);
    uVar5 = uVar4 >> 1 & 0x7f;
    if (local_90._4_4_ == 0) {
      uVar5 = uVar4;
    }
    if ((uVar5 & 1) == 0) {
      auVar11._0_4_ = auVar11._4_4_;
      auVar11._8_4_ = auVar11._4_4_;
      auVar11._12_4_ = auVar11._4_4_;
    }
    fVar7 = auVar11._0_4_;
    fVar6 = -(float)local_c8 * fVar7;
    if ((uint)local_90 < 10) {
      fVar8 = (float)uStack_c0 * fVar7;
      if ((0x124U >> ((uint)local_90 & 0x1f) & 1) == 0) {
        if ((0x248U >> ((uint)local_90 & 0x1f) & 1) == 0) goto LAB_001060ef;
        fVar8 = local_78 - fVar8;
      }
      else {
        fVar8 = (local_78 - fVar8) * 0.5;
      }
      fVar6 = fVar6 + fVar8;
    }
LAB_001060ef:
    fVar8 = -local_c8._4_4_ * fVar7;
    fVar7 = (float)(uStack_c0 >> 0x20) * fVar7;
    if ((uint)local_90 - 7 < 3) {
      fVar7 = local_88 - fVar7;
LAB_0010611e:
      fVar8 = fVar8 + fVar7;
    }
    else if ((uint)local_90 - 4 < 3) {
      fVar7 = (local_88 - fVar7) * 0.5;
      goto LAB_0010611e;
    }
    local_b8 = auVar11;
    plutovg_matrix_translate(matrix,fVar6,fVar8);
    plutovg_matrix_scale(matrix,(float)local_b8._0_4_,(float)local_b8._0_4_);
  }
  local_68.view_width = (float)local_a8;
  local_68.view_height = (float)local_a8._4_4_;
LAB_00106144:
  render_children(element,context,&local_68);
  render_state_end(&local_68);
  return;
}

Assistant:

static void render_symbol(const element_t* element, const render_context_t* context, render_state_t* state, float x, float y, float width, float height)
{
    if(width <= 0.f || height <= 0.f || is_display_none(element))
        return;
    render_state_t new_state;
    render_state_begin(element, &new_state, state);

    new_state.view_width = width;
    new_state.view_height = height;
    plutovg_matrix_translate(&new_state.matrix, x, y);

    apply_view_transform(&new_state, width, height);
    render_children(element, context, &new_state);
    render_state_end(&new_state);
}